

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  xmlXPathObjectPtr *ppxVar2;
  xmlNode *cur;
  uint uVar3;
  int iVar4;
  xmlChar *utf;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr value;
  
  if (nargs == 0) {
    if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
      cur = ctxt->context->node;
      if (cur == (xmlNode *)0x0) {
        pxVar5 = xmlXPathCacheNewFloat(ctxt,0.0);
        xmlXPathValuePush(ctxt,pxVar5);
        return;
      }
      utf = xmlNodeGetContent(cur);
      if (utf == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      iVar4 = xmlUTF8Strlen(utf);
      pxVar5 = xmlXPathCacheNewFloat(ctxt,(double)iVar4);
      xmlXPathValuePush(ctxt,pxVar5);
      (*xmlFree)(utf);
      return;
    }
    return;
  }
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iVar4 = 0xc;
    goto LAB_001bf16a;
  }
  uVar3 = ctxt->valueNr;
  if ((int)uVar3 < 1) {
    iVar4 = 0x17;
    goto LAB_001bf16a;
  }
  if (ctxt->value == (xmlXPathObjectPtr)0x0) {
LAB_001bf162:
    iVar4 = 0xb;
LAB_001bf16a:
    xmlXPathErr(ctxt,iVar4);
    return;
  }
  if (ctxt->value->type != XPATH_STRING) {
    xmlXPathStringFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
    goto LAB_001bf162;
    uVar3 = ctxt->valueNr;
    if ((int)uVar3 < 1) {
      pxVar5 = (xmlXPathObjectPtr)0x0;
      goto LAB_001bf18f;
    }
  }
  uVar1 = uVar3 - 1;
  ctxt->valueNr = uVar1;
  ppxVar2 = ctxt->valueTab;
  if (uVar3 == 1) {
    pxVar5 = (xmlXPathObjectPtr)0x0;
  }
  else {
    pxVar5 = ppxVar2[(ulong)uVar3 - 2];
  }
  ctxt->value = pxVar5;
  pxVar5 = ppxVar2[uVar1];
  ppxVar2[uVar1] = (xmlXPathObjectPtr)0x0;
LAB_001bf18f:
  iVar4 = xmlUTF8Strlen(pxVar5->stringval);
  value = xmlXPathCacheNewFloat(ctxt,(double)iVar4);
  xmlXPathValuePush(ctxt,value);
  xmlXPathReleaseObject(ctxt->context,pxVar5);
  return;
}

Assistant:

void
xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
        if ((ctxt == NULL) || (ctxt->context == NULL))
	    return;
	if (ctxt->context->node == NULL) {
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0));
	} else {
	    xmlChar *content;

	    content = xmlXPathCastNodeToString(ctxt->context->node);
            if (content == NULL)
                xmlXPathPErrMemory(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
		xmlUTF8Strlen(content)));
	    xmlFree(content);
	}
	return;
    }
    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    cur = xmlXPathValuePop(ctxt);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	xmlUTF8Strlen(cur->stringval)));
    xmlXPathReleaseObject(ctxt->context, cur);
}